

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterValidator.cpp
# Opt level: O2

Result * CoreML::validateInt64Parameter
                   (Result *__return_storage_ptr__,string *parameterName,
                   Int64Parameter *int64Parameter,bool shouldBePositive)

{
  long __val;
  long lVar1;
  bool bVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string err;
  string local_38;
  
  bVar2 = !shouldBePositive;
  __val = int64Parameter->defaultvalue_;
  if (0 < __val || bVar2) {
    if (int64Parameter->_oneof_case_[0] == 10) {
      lVar3 = ((int64Parameter->AllowedValues_).range_)->minvalue_;
      if (0 < lVar3 || bVar2) {
        lVar1 = ((int64Parameter->AllowedValues_).range_)->maxvalue_;
        if (0 < lVar1 || bVar2) {
          if (lVar3 <= __val && __val <= lVar1) goto LAB_002847f8;
          std::__cxx11::to_string(&local_38,__val);
          std::operator+(&bStack_b8,"Specified Default Value (",&local_38);
          std::operator+(&local_98,&bStack_b8,") out of Allowed Value Range for \'");
          std::operator+(&local_78,&local_98,parameterName);
          std::operator+(&err,&local_78,"\'");
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&bStack_b8);
          std::__cxx11::string::~string((string *)&local_38);
          Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
        }
        else {
          std::__cxx11::to_string(&local_38,lVar1);
          std::operator+(&bStack_b8,"Non-positive max value (",&local_38);
          std::operator+(&local_98,&bStack_b8,") in Allowed Value Range for \'");
          std::operator+(&local_78,&local_98,parameterName);
          std::operator+(&err,&local_78,"\' is not allowed.");
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&bStack_b8);
          std::__cxx11::string::~string((string *)&local_38);
          Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
        }
      }
      else {
        std::__cxx11::to_string(&local_38,lVar3);
        std::operator+(&bStack_b8,"Non-positive min value (",&local_38);
        std::operator+(&local_98,&bStack_b8,") in Allowed Value Range for \'");
        std::operator+(&local_78,&local_98,parameterName);
        std::operator+(&err,&local_78,"\' is not allowed.");
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&bStack_b8);
        std::__cxx11::string::~string((string *)&local_38);
        Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
      }
    }
    else {
      if (int64Parameter->_oneof_case_[0] != 0xb) {
LAB_002847f8:
        Result::Result(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      lVar3 = 0;
      do {
        if ((long)(((int64Parameter->AllowedValues_).set_)->values_).current_size_ * 8 == lVar3) {
          std::__cxx11::to_string(&local_38,__val);
          std::operator+(&bStack_b8,"Specified Default Value (",&local_38);
          std::operator+(&local_98,&bStack_b8,") not found in Allowed Values Set for \'");
          std::operator+(&local_78,&local_98,parameterName);
          std::operator+(&err,&local_78,"\'");
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&bStack_b8);
          std::__cxx11::string::~string((string *)&local_38);
          Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
          goto LAB_00284446;
        }
        lVar1 = *(long *)((long)(((int64Parameter->AllowedValues_).set_)->values_).
                                arena_or_elements_ + lVar3);
        if (lVar1 == __val) goto LAB_002847f8;
        lVar3 = lVar3 + 8;
      } while (0 < lVar1 || bVar2);
      std::__cxx11::to_string(&local_38,lVar1);
      std::operator+(&bStack_b8,"Non-positive value (",&local_38);
      std::operator+(&local_98,&bStack_b8,") in Allowed Values Set for \'");
      std::operator+(&local_78,&local_98,parameterName);
      std::operator+(&err,&local_78,"\' is not allowed.");
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&bStack_b8);
      std::__cxx11::string::~string((string *)&local_38);
      Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
    }
  }
  else {
    std::__cxx11::to_string(&local_38,__val);
    std::operator+(&bStack_b8,"Default Value (",&local_38);
    std::operator+(&local_98,&bStack_b8,") for \'");
    std::operator+(&local_78,&local_98,parameterName);
    std::operator+(&err,&local_78,"\' expected to be a positive value.");
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&bStack_b8);
    std::__cxx11::string::~string((string *)&local_38);
    Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
  }
LAB_00284446:
  std::__cxx11::string::~string((string *)&err);
  return __return_storage_ptr__;
}

Assistant:

Result CoreML::validateInt64Parameter(const std::string& parameterName, const Specification::Int64Parameter& int64Parameter, bool shouldBePositive) {

    const ::google::protobuf::int64 defaultValue = int64Parameter.defaultvalue();

    if (shouldBePositive) {
        if (defaultValue <= 0) {
            std::string err = "Default Value (" + std::to_string(defaultValue) + ") for '" + parameterName + "' expected to be a positive value.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
    }

    if (int64Parameter.has_set()) {
        bool valueFoundInSet = false;
        for (const auto &value : int64Parameter.set().values()) {
            if (value == defaultValue) {
                valueFoundInSet = true;
                break;
            }
            if (value <= 0 && shouldBePositive) {
                std::string err = "Non-positive value (" + std::to_string(value) + ") in Allowed Values Set for '" + parameterName + "' is not allowed.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
        }
        if (false == valueFoundInSet) {
            std::string err = "Specified Default Value (" + std::to_string(defaultValue) + ") not found in Allowed Values Set for '" + parameterName + "'";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
    }
    else if (int64Parameter.has_range()) {
        const Specification::Int64Range& range = int64Parameter.range();

        if (range.minvalue() <= 0 && shouldBePositive) {
            std::string err = "Non-positive min value (" + std::to_string(range.minvalue()) + ") in Allowed Value Range for '" + parameterName + "' is not allowed.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }

        if (range.maxvalue() <= 0 && shouldBePositive) {
            std::string err = "Non-positive max value (" + std::to_string(range.maxvalue()) + ") in Allowed Value Range for '" + parameterName + "' is not allowed.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }

        if (defaultValue < range.minvalue() || defaultValue > range.maxvalue()) {
            std::string err = "Specified Default Value (" + std::to_string(defaultValue) + ") out of Allowed Value Range for '" + parameterName + "'";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }

        if (range.minvalue() > range.maxvalue()) {
            std::string err = "Specified minimum value (" + std::to_string(defaultValue) + ") greater than maximum value for '" + parameterName + "'";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);

        }
    }

    return Result();
}